

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.hpp
# Opt level: O3

bool CheckCin(void)

{
  uint uVar1;
  
  uVar1 = *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18));
  if ((uVar1 & 5) != 0) {
    std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x10a1b8);
    std::istream::ignore((long)&std::cin,0x7fff);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool CheckCin() {
    if (std::cin.fail()) {
        std::cin.clear();
        std::cin.ignore(32767, '\n');
        return false;
    }
    return true;
}